

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandit.h
# Opt level: O2

bool __thiscall
bandit::run_policy::bandit::should_run(bandit *this,string *it_name,stack_t *contexts)

{
  pointer pfVar1;
  bool bVar2;
  int iVar3;
  pointer pfVar4;
  filter_chain_element filter;
  filter_chain_element fStack_58;
  
  if ((this->dry_run_ != false) ||
     (((this->break_on_failure_ == true &&
       (iVar3 = (*(this->super_interface)._vptr_interface[4])(this), (char)iVar3 != '\0')) ||
      (bVar2 = has_context_with_hard_skip(this,contexts), bVar2)))) {
LAB_0010e497:
    bVar2 = false;
  }
  else {
    pfVar1 = (this->filter_chain_).
             super__Vector_base<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pfVar4 = (this->filter_chain_).
                  super__Vector_base<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
                  ._M_impl.super__Vector_impl_data._M_start; pfVar4 != pfVar1; pfVar4 = pfVar4 + 1)
    {
      filter_chain_element::filter_chain_element(&fStack_58,pfVar4);
      bVar2 = context_matches_pattern(this,contexts,&fStack_58.pattern);
      if (bVar2) {
        if (fStack_58.skip != false) {
LAB_0010e48f:
          std::__cxx11::string::~string((string *)&fStack_58);
          goto LAB_0010e497;
        }
      }
      else {
        bVar2 = matches_pattern(this,it_name,&fStack_58.pattern);
        if (bVar2 == fStack_58.skip) goto LAB_0010e48f;
      }
      std::__cxx11::string::~string((string *)&fStack_58);
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool should_run(const std::string& it_name, const context::stack_t& contexts) const override {
        if (dry_run_) {
          return false;
        }

        if (break_on_failure_ && has_encountered_failure()) {
          return false;
        }

        // Never run if a context has been marked as skip
        // using 'describe_skip'
        if (has_context_with_hard_skip(contexts)) {
          return false;
        }

        // Now go through the filter chain
        for (auto filter : filter_chain_) {
          bool match = context_matches_pattern(contexts, filter.pattern) || matches_pattern(it_name, filter.pattern);
          bool skip_applies = filter.skip && match;
          bool only_applies = !filter.skip && !match;
          if (skip_applies || only_applies) {
            return false;
          }
        }

        return true;
      }